

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MammalHandler.cpp
# Opt level: O3

void __thiscall MammalHandler::handleRequest(MammalHandler *this,string *name)

{
  pointer pbVar1;
  pointer pcVar2;
  AnimalHandler *pAVar3;
  int iVar4;
  pointer pbVar5;
  long *local_78 [2];
  long local_68 [2];
  MammalHandler *local_58;
  size_type *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> i;
  
  pbVar5 = (this->super_AnimalHandler).nameList.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->super_AnimalHandler).nameList.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_58 = this;
  if (pbVar5 != pbVar1) {
    do {
      pcVar2 = (pbVar5->_M_dataplus)._M_p;
      local_50 = &i._M_string_length;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar2,pcVar2 + pbVar5->_M_string_length);
      if (i._M_dataplus._M_p == (pointer)name->_M_string_length) {
        if (i._M_dataplus._M_p != (pointer)0x0) {
          iVar4 = bcmp(local_50,(name->_M_dataplus)._M_p,(size_t)i._M_dataplus._M_p);
          if (iVar4 != 0) goto LAB_0010f0ec;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"class::MammalHandler  method::handleRequest\n",0x2c);
      }
LAB_0010f0ec:
      if (local_50 != &i._M_string_length) {
        operator_delete(local_50,i._M_string_length + 1);
      }
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != pbVar1);
  }
  pAVar3 = (local_58->super_AnimalHandler).myHandler;
  if (pAVar3 != (AnimalHandler *)0x0) {
    pcVar2 = (name->_M_dataplus)._M_p;
    local_78[0] = local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_78,pcVar2,pcVar2 + name->_M_string_length);
    (*pAVar3->_vptr_AnimalHandler[2])(pAVar3,(string *)local_78);
    if (local_78[0] != local_68) {
      operator_delete(local_78[0],local_68[0] + 1);
    }
  }
  return;
}

Assistant:

void MammalHandler::handleRequest(std::string name) {
    for (auto i : nameList) {
        if (i == name) {
            std::cout << "class::MammalHandler  method::handleRequest\n";
        }
    }
    if (myHandler != nullptr) {
        myHandler->handleRequest(name);
    }
}